

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall
coins_tests::updatecoins_simulation_test::test_method(updatecoins_simulation_test *this)

{
  key_type *__k;
  _Base_ptr *this_00;
  long lVar1;
  COutPoint *out;
  CCoinsViewCache *pCVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  undefined1 uVar8;
  pointer outIn;
  pointer puVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  CCoinsViewCacheTest *pCVar13;
  uint64_t uVar14;
  iterator iVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  unsigned_long uVar18;
  long lVar19;
  Coin *a;
  _Rb_tree_node_base *p_Var20;
  uint uVar21;
  CScript *this_01;
  ulong uVar22;
  pointer this_02;
  iterator in_R8;
  iterator pvVar23;
  iterator in_R9;
  iterator pvVar24;
  RandomMixin<FastRandomContext> *this_03;
  key_type *__x;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  RandomMixin<FastRandomContext> *this_04;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  CMutableTransaction tx;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  CTxUndo undo;
  undefined8 uStack_280;
  COutPoint outpoint;
  Coin coin;
  Coin old_coin;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> utxoset;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> duplicate_coins;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> disconnected_coins;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> coinbase_coins;
  CCoinsViewTest base;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest((BasicTestingSetup *)this,ZEROS);
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result._M_t._M_impl.super__Rb_tree_header._M_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_03 = &(this->super_UpdateTest).super_BasicTestingSetup.m_rng.
             super_RandomMixin<FastRandomContext>;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &base.map_._M_t._M_impl.super__Rb_tree_header._M_header;
  base.super_CCoinsView._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_0113b450;
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stack.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  base.m_rng = (FastRandomContext *)this_03;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar13 = (CCoinsViewCacheTest *)operator_new(0x1c8);
  anon_unknown.dwarf_4a5d0d::CCoinsViewCacheTest::CCoinsViewCacheTest
            (pCVar13,&base.super_CCoinsView);
  coin.out.nValue = (CAmount)pCVar13;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&stack,(value_type *)&coin);
  if (coin.out.nValue != 0) {
    (**(code **)(*(long *)coin.out.nValue + 0x38))();
  }
  coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_header;
  coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_header;
  disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_header;
  duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  utxoset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &utxoset._M_t._M_impl.super__Rb_tree_header._M_header;
  utxoset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  utxoset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  utxoset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar19 = 0;
  uVar8 = 0;
  utxoset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       utxoset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (lVar19 == 40000) {
      local_3f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3e8 = "";
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_04.m_end = in_R9;
      msg_04.m_begin = in_R8;
      file_04.m_end = (iterator)0x1fe;
      file_04.m_begin = (iterator)&local_3f0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_400,
                 msg_04);
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      old_coin.out.nValue = (CAmount)anon_var_dwarf_49dd93;
      old_coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = "";
      coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect
                   & 0xffffffffffffff00);
      coin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
      coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &old_coin;
      local_410 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_408 = "";
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = uVar8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx,(lazy_ostream *)&coin,1,0,WARN,(check_type)this_03,
                 (size_t)&local_410,0x1fe);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&utxoset._M_t);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&duplicate_coins._M_t);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&disconnected_coins._M_t);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&coinbase_coins._M_t);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::~vector(&stack);
      anon_unknown.dwarf_4a5d0d::CCoinsViewTest::~CCoinsViewTest(&base);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&result._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    uVar14 = RandomMixin<FastRandomContext>::randbits<32>(this_03);
    uVar21 = (uint)((uVar14 & 0xffffffff) % 0x14);
    if (uVar21 < 0x13) {
      CMutableTransaction::CMutableTransaction(&tx);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
      (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start)->nValue = lVar19;
      this_01 = &(tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey;
      this_04 = this_03;
      uVar14 = RandomMixin<FastRandomContext>::randbits<32>(this_03);
      coin.out.nValue = coin.out.nValue & 0xffffffffffffff00;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                (&this_01->super_CScriptBase,(uint)uVar14 & 0x3f,(uchar *)&coin);
      uVar14 = RandomMixin<FastRandomContext>::randbits<32>(this_03);
      Coin::Coin(&old_coin);
      if ((uVar21 < 2) || (coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_node_count < 10)) {
        iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_04,10);
        if ((iVar12 == 0) && (coinbase_coins._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
        {
          iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&coinbase_coins);
          CMutableTransaction::CMutableTransaction
                    ((CMutableTransaction *)&coin,(CTransaction *)&iVar15._M_node[4]._M_left);
          CMutableTransaction::operator=(&tx,(CMutableTransaction *)&coin);
          CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&coin);
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::erase(&disconnected_coins._M_t,(key_type *)(iVar15._M_node + 1));
          std::
          _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
          ::_M_insert_unique<COutPoint_const&>
                    ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                      *)&duplicate_coins,(key_type *)(iVar15._M_node + 1));
        }
        else {
          CMutableTransaction::GetHash((Txid *)&undo,&tx);
          coin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
               undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = uStack_280;
          coin.out.nValue =
               (CAmount)undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                        super__Vector_impl_data._M_start;
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          coin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::_M_insert_unique<COutPoint>(&coinbase_coins._M_t,(COutPoint *)&coin);
        }
        CTransaction::CTransaction((CTransaction *)&coin,&tx);
        bVar10 = CTransaction::IsCoinBase((CTransaction *)&coin);
        if (!bVar10) {
          __assert_fail("CTransaction(tx).IsCoinBase()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                        ,0x170,"void coins_tests::updatecoins_simulation_test::test_method()");
        }
        CTransaction::~CTransaction((CTransaction *)&coin);
LAB_002b11fc:
        if ((long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x28) {
          __assert_fail("tx.vout.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                        ,0x1a1,"void coins_tests::updatecoins_simulation_test::test_method()");
        }
        CMutableTransaction::GetHash((Txid *)&coin,&tx);
        outIn = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
             coin.out.scriptPubKey.super_CScriptBase._union._8_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             coin.out.scriptPubKey.super_CScriptBase._union._9_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             coin.out.scriptPubKey.super_CScriptBase._union._10_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             coin.out.scriptPubKey.super_CScriptBase._union._11_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             coin.out.scriptPubKey.super_CScriptBase._union._12_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             coin.out.scriptPubKey.super_CScriptBase._union._13_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             coin.out.scriptPubKey.super_CScriptBase._union._14_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             coin.out.scriptPubKey.super_CScriptBase._union._15_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
             coin.out.scriptPubKey.super_CScriptBase._union._16_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             coin.out.scriptPubKey.super_CScriptBase._union._17_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             coin.out.scriptPubKey.super_CScriptBase._union._18_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             coin.out.scriptPubKey.super_CScriptBase._union._19_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
             coin.out.scriptPubKey.super_CScriptBase._union._20_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             coin.out.scriptPubKey.super_CScriptBase._union._21_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             coin.out.scriptPubKey.super_CScriptBase._union._22_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             coin.out.scriptPubKey.super_CScriptBase._union._23_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
             (undefined1)coin.out.nValue;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = coin.out.nValue._1_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = coin.out.nValue._2_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = coin.out.nValue._3_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = coin.out.nValue._4_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = coin.out.nValue._5_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = coin.out.nValue._6_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = coin.out.nValue._7_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
        outpoint.n = 0;
        CTransaction::CTransaction((CTransaction *)&coin,&tx);
        bVar10 = CTransaction::IsCoinBase((CTransaction *)&coin);
        uVar21 = (uint)(uVar14 >> 1) & 0x7fffffff;
        Coin::Coin((Coin *)&undo,outIn,uVar21,bVar10);
        pmVar17 = std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::operator[](&result,&outpoint);
        Coin::operator=(pmVar17,(Coin *)&undo);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   &undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        CTransaction::~CTransaction((CTransaction *)&coin);
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CTransaction::CTransaction((CTransaction *)&coin,&tx);
        UpdateCoins((CTransaction *)&coin,
                    &(stack.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl)->super_CCoinsViewCache,&undo,uVar21);
        CTransaction::~CTransaction((CTransaction *)&coin);
        std::
        _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
        ::_M_insert_unique<COutPoint_const&>
                  ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                    *)&utxoset,&outpoint);
        std::_Tuple_impl<0ul,CMutableTransaction,CTxUndo,Coin>::
        _Tuple_impl<CMutableTransaction&,CTxUndo&,Coin&,void>
                  ((_Tuple_impl<0ul,CMutableTransaction,CTxUndo,Coin> *)&coin,&tx,
                   (CTxUndo *)&undo.vprevout,&old_coin);
        std::
        _Rb_tree<COutPoint,std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>,std::_Select1st<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>>
        ::_M_emplace_unique<COutPoint_const&,std::tuple<CMutableTransaction,CTxUndo,Coin>>
                  ((_Rb_tree<COutPoint,std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>,std::_Select1st<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>>
                    *)&(this->super_UpdateTest).utxoData,&outpoint,
                   (tuple<CMutableTransaction,_CTxUndo,_Coin> *)&coin);
        std::_Tuple_impl<0UL,_CMutableTransaction,_CTxUndo,_Coin>::~_Tuple_impl
                  ((_Tuple_impl<0UL,_CMutableTransaction,_CTxUndo,_Coin> *)&coin);
        std::vector<Coin,_std::allocator<Coin>_>::~vector(&undo.vprevout);
        bVar10 = true;
      }
      else {
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((uVar21 != 2) ||
           (disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
          iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&utxoset);
          undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)(iVar15._M_node + 1);
          undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)iVar15._M_node[1]._M_parent;
          undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)iVar15._M_node[1]._M_left;
          uStack_280 = iVar15._M_node[1]._M_right;
          puVar7 = (undefined8 *)
                   CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            (byte)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          uVar3 = *(undefined8 *)(iVar15._M_node + 1);
          p_Var4 = iVar15._M_node[1]._M_parent;
          p_Var5 = iVar15._M_node[1]._M_left;
          p_Var6 = iVar15._M_node[1]._M_right;
          *(_Rb_tree_color *)(puVar7 + 4) = iVar15._M_node[2]._M_color;
          puVar7[2] = p_Var5;
          puVar7[3] = p_Var6;
          *puVar7 = uVar3;
          puVar7[1] = p_Var4;
          CTransaction::CTransaction((CTransaction *)&coin,&tx);
          bVar10 = CTransaction::IsCoinBase((CTransaction *)&coin);
          if (bVar10) {
            __assert_fail("!CTransaction(tx).IsCoinBase()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                          ,400,"void coins_tests::updatecoins_simulation_test::test_method()");
          }
          CTransaction::~CTransaction((CTransaction *)&coin);
LAB_002b117c:
          pmVar17 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::operator[](&result,(key_type *)&undo);
          Coin::operator=(&old_coin,pmVar17);
          pmVar17 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::operator[](&result,(key_type *)&undo);
          Coin::Clear(pmVar17);
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::erase(&utxoset._M_t,(key_type *)&undo);
          sVar16 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                             (&duplicate_coins,(key_type *)&undo);
          if (sVar16 != 0) {
            uVar8 = 1;
          }
          goto LAB_002b11fc;
        }
        iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&disconnected_coins);
        CMutableTransaction::CMutableTransaction
                  ((CMutableTransaction *)&coin,(CTransaction *)&iVar15._M_node[4]._M_left);
        CMutableTransaction::operator=(&tx,(CMutableTransaction *)&coin);
        CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&coin);
        puVar7 = (undefined8 *)
                 CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          (byte)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start);
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar7;
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar7[1];
        undo.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[2];
        uStack_280 = puVar7[3];
        CTransaction::CTransaction((CTransaction *)&coin,&tx);
        bVar10 = CTransaction::IsCoinBase((CTransaction *)&coin);
        __x = (key_type *)(iVar15._M_node + 1);
        if (bVar10) {
          CTransaction::~CTransaction((CTransaction *)&coin);
LAB_002b110e:
          sVar16 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                             (&utxoset,__x);
          if (sVar16 != 0) {
            CTransaction::CTransaction((CTransaction *)&coin,&tx);
            bVar10 = CTransaction::IsCoinBase((CTransaction *)&coin);
            if (!bVar10) {
              __assert_fail("CTransaction(tx).IsCoinBase()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,0x183,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
            CTransaction::~CTransaction((CTransaction *)&coin);
            sVar16 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                               (&duplicate_coins,__x);
            if (sVar16 == 0) {
              __assert_fail("duplicate_coins.count(utxod->first)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,0x184,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
          }
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::erase(&disconnected_coins._M_t,__x);
          goto LAB_002b117c;
        }
        sVar16 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                           (&utxoset,(key_type *)&undo);
        CTransaction::~CTransaction((CTransaction *)&coin);
        if (sVar16 != 0) goto LAB_002b110e;
        std::
        _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
        ::erase(&disconnected_coins._M_t,__x);
        bVar10 = false;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                (&old_coin.out.scriptPubKey.super_CScriptBase);
      CMutableTransaction::~CMutableTransaction(&tx);
      this_03 = this_04;
      if (bVar10) goto LAB_002b137f;
    }
    else {
      if (utxoset._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&utxoset);
        __k = (key_type *)(iVar15._M_node + 1);
        pmVar17 = std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::operator[](&result,__k);
        Coin::Clear(pmVar17);
        this_00 = &iVar15._M_node[4]._M_left;
        bVar10 = CTransaction::IsCoinBase((CTransaction *)this_00);
        if (!bVar10) {
          pmVar17 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::operator[](&result,(key_type *)*this_00);
          Coin::operator=(pmVar17,(Coin *)&iVar15._M_node[2]._M_parent);
        }
        local_300 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_2f8 = "";
        local_310 = &boost::unit_test::basic_cstring<char_const>::null;
        local_308 = &boost::unit_test::basic_cstring<char_const>::null;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        file.m_end = (iterator)0x1c1;
        file.m_begin = (iterator)&local_300;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_310,
                   msg);
        puVar9 = stack.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ =
             CCoinsViewCache::SpendCoin
                       (&(stack.
                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          .
                          super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                         ._M_head_impl)->super_CCoinsViewCache,__k,(Coin *)0x0);
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        old_coin.out.nValue = (CAmount)anon_var_dwarf_49dd11;
        old_coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = "";
        coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect & 0xffffffffffffff00);
        coin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
        coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
        coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &old_coin;
        local_320 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_318 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx,(lazy_ostream *)&coin,1,0,WARN,(check_type)this_03,
                   (size_t)&local_320,0x1c1);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        bVar10 = CTransaction::IsCoinBase((CTransaction *)this_00);
        if (!bVar10) {
          out = (COutPoint *)iVar15._M_node[4]._M_left;
          Coin::Coin(&coin,(Coin *)iVar15._M_node[3]._M_right);
          ApplyTxInUndo(&coin,&(puVar9[-1]._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                               ._M_head_impl)->super_CCoinsViewCache,out);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    (&coin.out.scriptPubKey.super_CScriptBase);
        }
        std::
        _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
        ::_M_insert_unique<COutPoint_const&>
                  ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                    *)&disconnected_coins,__k);
        std::
        _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
        ::erase(&utxoset._M_t,__k);
        bVar10 = CTransaction::IsCoinBase((CTransaction *)this_00);
        if (!bVar10) {
          std::
          _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
          ::_M_insert_unique<COutPoint_const&>
                    ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                      *)&utxoset,(COutPoint *)*this_00);
        }
      }
LAB_002b137f:
      iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_03,1000);
      p_Var20 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((lVar19 == 39999) || (iVar12 == 1)) {
        for (; (_Rb_tree_header *)p_Var20 != &result._M_t._M_impl.super__Rb_tree_header;
            p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
          pCVar13 = stack.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
          bVar11 = (**(code **)(*(long *)&(pCVar13->super_CCoinsViewCache).super_CCoinsViewBacked +
                               8))(pCVar13,(COutPoint *)(p_Var20 + 1));
          a = CCoinsViewCache::AccessCoin
                        (&(stack.
                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                           super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           .
                           super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                          ._M_head_impl)->super_CCoinsViewCache,(COutPoint *)(p_Var20 + 1));
          local_330 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_328 = "";
          local_340 = &boost::unit_test::basic_cstring<char_const>::null;
          local_338 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_01.m_end = in_R9;
          msg_01.m_begin = in_R8;
          file_01.m_end = (iterator)0x1d6;
          file_01.m_begin = (iterator)&local_330;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_340,msg_01);
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = bVar11 ^ (a->out).nValue == -1;
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          old_coin.out.nValue = (CAmount)anon_var_dwarf_49dd2b;
          old_coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = "";
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)((ulong)coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                               indirect & 0xffffffffffffff00);
          coin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
          coin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
               boost::unit_test::lazy_ostream::inst;
          coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &old_coin;
          local_350 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_348 = "";
          pvVar23 = &DAT_00000001;
          pvVar24 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&tx,(lazy_ostream *)&coin,1,0,WARN,(check_type)this_03,
                     (size_t)&local_350,0x1d6);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          local_360 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_358 = "";
          local_370 = &boost::unit_test::basic_cstring<char_const>::null;
          local_368 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_02.m_end = pvVar24;
          msg_02.m_begin = pvVar23;
          file_02.m_end = (iterator)0x1d7;
          file_02.m_begin = (iterator)&local_360;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_370,msg_02);
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = anon_unknown.dwarf_4a5d0d::operator==(a,(Coin *)&p_Var20[2]._M_parent);
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          old_coin.out.nValue = (CAmount)anon_var_dwarf_49dd45;
          old_coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = "";
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)((ulong)coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                               indirect & 0xffffffffffffff00);
          coin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
          coin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
               boost::unit_test::lazy_ostream::inst;
          coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &old_coin;
          local_380 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_378 = "";
          in_R8 = &DAT_00000001;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&tx,(lazy_ostream *)&coin,1,0,WARN,(check_type)this_03,
                     (size_t)&local_380,0x1d7);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
      }
      if ((1 < utxoset._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
         (iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_03,0x1e), iVar12 == 0)) {
        uVar14 = RandomMixin<FastRandomContext>::randbits<32>(this_03);
        pCVar2 = &(stack.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(uVar14 & 0xffffffff) %
                    (ulong)((long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache;
        iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&utxoset);
        CCoinsViewCache::Uncache(pCVar2,(COutPoint *)(iVar15._M_node + 1));
      }
      if ((1 < disconnected_coins._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
         (iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_03,0x1e), iVar12 == 0)) {
        uVar14 = RandomMixin<FastRandomContext>::randbits<32>(this_03);
        pCVar2 = &(stack.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(uVar14 & 0xffffffff) %
                    (ulong)((long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache;
        iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&disconnected_coins);
        CCoinsViewCache::Uncache(pCVar2,(COutPoint *)(iVar15._M_node + 1));
      }
      if ((1 < duplicate_coins._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
         (iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_03,0x1e), iVar12 == 0)) {
        uVar14 = RandomMixin<FastRandomContext>::randbits<32>(this_03);
        pCVar2 = &(stack.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(uVar14 & 0xffffffff) %
                    (ulong)((long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache;
        iVar15 = UpdateTest::FindRandomFrom(&this->super_UpdateTest,&duplicate_coins);
        CCoinsViewCache::Uncache(pCVar2,(COutPoint *)(iVar15._M_node + 1));
      }
      this_04 = this_03;
      iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_03,100);
      puVar9 = stack.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((iVar12 == 0) &&
          (uVar22 = (long)stack.
                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)stack.
                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3, 1 < uVar22)) &&
         (bVar10 = RandomMixin<FastRandomContext>::randbool(this_03), !bVar10)) {
        uVar18 = RandomMixin<FastRandomContext>::randrange<unsigned_long>(this_03,uVar22 - 1);
        local_390 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_388 = "";
        local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_398 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_00.m_end = in_R9;
        msg_00.m_begin = in_R8;
        file_00.m_end = (iterator)0x1ea;
        file_00.m_begin = (iterator)&local_390;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3a0
                   ,msg_00);
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ =
             CCoinsViewCache::Flush
                       (&(puVar9[uVar18 & 0xffffffff]._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          .
                          super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                         ._M_head_impl)->super_CCoinsViewCache);
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        old_coin.out.nValue = (CAmount)anon_var_dwarf_49dd5f;
        old_coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = "";
        coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect & 0xffffffffffffff00);
        coin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
        coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
        coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &old_coin;
        local_3b0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_3a8 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx,(lazy_ostream *)&coin,1,0,WARN,(check_type)this_04,
                   (size_t)&local_3b0,0x1ea);
        this_03 = this_04;
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        this_04 = this_03;
      }
      iVar12 = RandomMixin<FastRandomContext>::randrange<int>(this_03,100);
      this_02 = stack.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar9 = stack.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar12 == 0) {
        if ((stack.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             stack.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
           (bVar10 = RandomMixin<FastRandomContext>::randbool(this_04), !bVar10)) {
          local_3c0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_3b8 = "";
          local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_03.m_end = in_R9;
          msg_03.m_begin = in_R8;
          file_03.m_end = (iterator)0x1f0;
          file_03.m_begin = (iterator)&local_3c0;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_3d0,msg_03);
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ =
               CCoinsViewCache::Flush
                         (&(this_02[-1]._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                           ._M_head_impl)->super_CCoinsViewCache);
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          old_coin.out.nValue = (CAmount)anon_var_dwarf_49dd79;
          old_coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = "";
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)((ulong)coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                               indirect & 0xffffffffffffff00);
          coin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
          coin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
               boost::unit_test::lazy_ostream::inst;
          coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &old_coin;
          local_3e0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_3d8 = "";
          in_R8 = &DAT_00000001;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&tx,(lazy_ostream *)&coin,1,0,WARN,(check_type)this_04,
                     (size_t)&local_3e0,0x1f0);
          this_02 = this_02 + -1;
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          stack.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = this_02;
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::~unique_ptr(this_02);
        }
        if (this_02 == puVar9) {
          coin.out.nValue = (CAmount)&base;
        }
        else {
          if ((0x1f < (ulong)((long)this_02 - (long)puVar9)) ||
             (bVar10 = RandomMixin<FastRandomContext>::randbool(this_04), !bVar10))
          goto LAB_002b1668;
          coin.out.nValue =
               (CAmount)this_02[-1]._M_t.
                        super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                        _M_head_impl;
        }
        std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsView*&>
                  ((CCoinsView **)&tx);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::push_back(&stack,(value_type *)&tx);
        if ((long *)CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             (byte)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                   super__Vector_impl_data._M_start) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         (byte)tx.vin.
                                               super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                               _M_impl.super__Vector_impl_data._M_start) + 0x38))();
        }
      }
    }
LAB_002b1668:
    lVar19 = lVar19 + 1;
    this_03 = this_04;
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(updatecoins_simulation_test, UpdateTest)
{
    SeedRandomForTest(SeedRand::ZEROS);

    bool spent_a_duplicate_coinbase = false;
    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    CCoinsViewTest base{m_rng}; // A CCoinsViewTest at the bottom.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(&base)); // Start with one cache.

    // Track the txids we've used in various sets
    std::set<COutPoint> coinbase_coins;
    std::set<COutPoint> disconnected_coins;
    std::set<COutPoint> duplicate_coins;
    std::set<COutPoint> utxoset;

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        uint32_t randiter = m_rng.rand32();

        // 19/20 txs add a new transaction
        if (randiter % 20 < 19) {
            CMutableTransaction tx;
            tx.vin.resize(1);
            tx.vout.resize(1);
            tx.vout[0].nValue = i; //Keep txs unique unless intended to duplicate
            tx.vout[0].scriptPubKey.assign(m_rng.rand32() & 0x3F, 0); // Random sizes so we can test memory usage accounting
            const int height{int(m_rng.rand32() >> 1)};
            Coin old_coin;

            // 2/20 times create a new coinbase
            if (randiter % 20 < 2 || coinbase_coins.size() < 10) {
                // 1/10 of those times create a duplicate coinbase
                if (m_rng.randrange(10) == 0 && coinbase_coins.size()) {
                    auto utxod = FindRandomFrom(coinbase_coins);
                    // Reuse the exact same coinbase
                    tx = CMutableTransaction{std::get<0>(utxod->second)};
                    // shouldn't be available for reconnection if it's been duplicated
                    disconnected_coins.erase(utxod->first);

                    duplicate_coins.insert(utxod->first);
                }
                else {
                    coinbase_coins.insert(COutPoint(tx.GetHash(), 0));
                }
                assert(CTransaction(tx).IsCoinBase());
            }

            // 17/20 times reconnect previous or add a regular tx
            else {

                COutPoint prevout;
                // 1/20 times reconnect a previously disconnected tx
                if (randiter % 20 == 2 && disconnected_coins.size()) {
                    auto utxod = FindRandomFrom(disconnected_coins);
                    tx = CMutableTransaction{std::get<0>(utxod->second)};
                    prevout = tx.vin[0].prevout;
                    if (!CTransaction(tx).IsCoinBase() && !utxoset.count(prevout)) {
                        disconnected_coins.erase(utxod->first);
                        continue;
                    }

                    // If this tx is already IN the UTXO, then it must be a coinbase, and it must be a duplicate
                    if (utxoset.count(utxod->first)) {
                        assert(CTransaction(tx).IsCoinBase());
                        assert(duplicate_coins.count(utxod->first));
                    }
                    disconnected_coins.erase(utxod->first);
                }

                // 16/20 times create a regular tx
                else {
                    auto utxod = FindRandomFrom(utxoset);
                    prevout = utxod->first;

                    // Construct the tx to spend the coins of prevouthash
                    tx.vin[0].prevout = prevout;
                    assert(!CTransaction(tx).IsCoinBase());
                }
                // In this simple test coins only have two states, spent or unspent, save the unspent state to restore
                old_coin = result[prevout];
                // Update the expected result of prevouthash to know these coins are spent
                result[prevout].Clear();

                utxoset.erase(prevout);

                // The test is designed to ensure spending a duplicate coinbase will work properly
                // if that ever happens and not resurrect the previously overwritten coinbase
                if (duplicate_coins.count(prevout)) {
                    spent_a_duplicate_coinbase = true;
                }

            }
            // Update the expected result to know about the new output coins
            assert(tx.vout.size() == 1);
            const COutPoint outpoint(tx.GetHash(), 0);
            result[outpoint] = Coin{tx.vout[0], height, CTransaction{tx}.IsCoinBase()};

            // Call UpdateCoins on the top cache
            CTxUndo undo;
            UpdateCoins(CTransaction{tx}, *(stack.back()), undo, height);

            // Update the utxo set for future spends
            utxoset.insert(outpoint);

            // Track this tx and undo info to use later
            utxoData.emplace(outpoint, std::make_tuple(tx,undo,old_coin));
        } else if (utxoset.size()) {
            //1/20 times undo a previous transaction
            auto utxod = FindRandomFrom(utxoset);

            CTransaction &tx = std::get<0>(utxod->second);
            CTxUndo &undo = std::get<1>(utxod->second);
            Coin &orig_coin = std::get<2>(utxod->second);

            // Update the expected result
            // Remove new outputs
            result[utxod->first].Clear();
            // If not coinbase restore prevout
            if (!tx.IsCoinBase()) {
                result[tx.vin[0].prevout] = orig_coin;
            }

            // Disconnect the tx from the current UTXO
            // See code in DisconnectBlock
            // remove outputs
            BOOST_CHECK(stack.back()->SpendCoin(utxod->first));
            // restore inputs
            if (!tx.IsCoinBase()) {
                const COutPoint &out = tx.vin[0].prevout;
                Coin coin = undo.vprevout[0];
                ApplyTxInUndo(std::move(coin), *(stack.back()), out);
            }
            // Store as a candidate for reconnection
            disconnected_coins.insert(utxod->first);

            // Update the utxoset
            utxoset.erase(utxod->first);
            if (!tx.IsCoinBase())
                utxoset.insert(tx.vin[0].prevout);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
            }
        }

        // One every 10 iterations, remove a random entry from the cache
        if (utxoset.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(utxoset)->first);
        }
        if (disconnected_coins.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(disconnected_coins)->first);
        }
        if (duplicate_coins.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(duplicate_coins)->first);
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                BOOST_CHECK(stack[flushIndex]->Flush());
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                BOOST_CHECK(stack.back()->Flush());
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                CCoinsView* tip = &base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(spent_a_duplicate_coinbase);
}